

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

void Eso_ManStop(Eso_Man_t *p)

{
  Hsh_VecMan_t *__ptr;
  
  Vec_WecFree(p->vEsops);
  __ptr = p->pHash;
  Vec_IntFree(__ptr->vTable);
  Vec_IntFree(__ptr->vData);
  Vec_IntFree(__ptr->vMap);
  free(__ptr);
  Vec_WecFree(p->vCubes);
  Vec_IntFree(p->vCube1);
  Vec_IntFree(p->vCube2);
  Vec_IntFree(p->vCube);
  free(p);
  return;
}

Assistant:

void Eso_ManStop( Eso_Man_t * p )
{
    Vec_WecFree( p->vEsops );
    Hsh_VecManStop( p->pHash );
    Vec_WecFree( p->vCubes );
    Vec_IntFree( p->vCube1 );
    Vec_IntFree( p->vCube2 );
    Vec_IntFree( p->vCube );
    ABC_FREE( p );
}